

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_read_common(lys_module *module,char *value,yytokentype type)

{
  int iVar1;
  char *pcVar2;
  char **target;
  
  if ((int)type < 0x137) {
    if (type != CONTACT_KEYWORD) {
      if (type == MODULE_KEYWORD) {
        pcVar2 = lydict_insert_zc(module->ctx,value);
        module->name = pcVar2;
        return 0;
      }
LAB_0015173c:
      free(value);
      ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_yang.c"
             ,0x44);
      return 1;
    }
    target = &module->contact;
    pcVar2 = "contact";
  }
  else if (type == NAMESPACE_KEYWORD) {
    target = &module->ns;
    pcVar2 = "namespace";
  }
  else {
    if (type != ORGANIZATION_KEYWORD) goto LAB_0015173c;
    target = &module->org;
    pcVar2 = "organization";
  }
  iVar1 = yang_check_string(module,target,pcVar2,"module",value,(lys_node *)0x0);
  return iVar1;
}

Assistant:

int
yang_read_common(struct lys_module *module, char *value, enum yytokentype type)
{
    int ret = 0;

    switch (type) {
    case MODULE_KEYWORD:
        module->name = lydict_insert_zc(module->ctx, value);
        break;
    case NAMESPACE_KEYWORD:
        ret = yang_check_string(module, &module->ns, "namespace", "module", value, NULL);
        break;
    case ORGANIZATION_KEYWORD:
        ret = yang_check_string(module, &module->org, "organization", "module", value, NULL);
        break;
    case CONTACT_KEYWORD:
        ret = yang_check_string(module, &module->contact, "contact", "module", value, NULL);
        break;
    default:
        free(value);
        LOGINT(module->ctx);
        ret = EXIT_FAILURE;
        break;
    }

    return ret;
}